

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

void __thiscall
libtorrent::resolver::async_resolve(resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  long lVar1;
  long lVar2;
  io_service *piVar3;
  iterator iVar4;
  time_point tVar5;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar6;
  error_code ec;
  undefined1 local_130 [8];
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_120 [4];
  _Head_base<0UL,_libtorrent::resolver_*,_false> local_e0;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  query q;
  address ip;
  
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ip::make_address(&ip,host,&ec);
  q.hints_._0_8_ = this;
  if (ec.failed_ == false) {
    piVar3 = this->m_ios;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)&q.hints_.ai_socktype,h);
    q.hints_.ai_next = (addrinfo *)CONCAT44(ec._4_4_,ec.val_);
    q.host_name_._M_dataplus._M_p = (pointer)ec.cat_;
    q.host_name_._M_string_length._0_4_ = ip.type_;
    q.host_name_._M_string_length._4_4_ = ip.ipv4_address_.addr_.s_addr;
    q.host_name_.field_2._M_allocated_capacity._0_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[0]
    ;
    q.host_name_.field_2._M_allocated_capacity._4_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[1]
    ;
    q.host_name_.field_2._8_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[2];
    q.host_name_.field_2._12_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[3];
    q.service_name_._M_dataplus._M_p = (pointer)ip.ipv6_address_.scope_id_;
    local_130 = (undefined1  [8])&q;
    pcVar6 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
              *)boost::asio::asio_handler_allocate(0x78);
    aaStack_120[0]._M_allocated_capacity =
         (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *)0x0;
    (pcVar6->super_operation).next_ = (scheduler_operation *)0x0;
    (pcVar6->super_operation).func_ =
         boost::asio::detail::
         completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
         ::do_complete;
    (pcVar6->super_operation).task_result_ = 0;
    local_128 = pcVar6;
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
    ::$_0::__0((__0 *)&pcVar6->handler_,(anon_class_88_4_ebb20b7f_for_handler_ *)&q);
    aaStack_120[0]._0_8_ = pcVar6;
    boost::asio::detail::scheduler::post_immediate_completion
              (piVar3->impl_,(operation *)pcVar6,false);
    local_128 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)0x0;
    aaStack_120[0]._M_allocated_capacity =
         (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *)0x0;
    boost::asio::detail::
    completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
    ::ptr::~ptr((ptr *)local_130);
LAB_002212b0:
    std::_Function_base::~_Function_base((_Function_base *)&q.hints_.ai_socktype);
    return;
  }
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cache)._M_h,host);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
      ._M_cur == (__node_type *)0x0) {
    if ((flags.m_val & 1) != 0) {
      piVar3 = this->m_ios;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&q.hints_.ai_socktype,h);
      local_130 = (undefined1  [8])&q;
      pcVar6 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)boost::asio::asio_handler_allocate(0x48);
      aaStack_120[0]._M_allocated_capacity =
           (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            *)0x0;
      (pcVar6->super_operation).next_ = (scheduler_operation *)0x0;
      (pcVar6->super_operation).func_ =
           boost::asio::detail::
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
           ::do_complete;
      (pcVar6->super_operation).task_result_ = 0;
      local_128 = pcVar6;
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
      ::$_2::__2((__2 *)&pcVar6->handler_,(anon_class_40_2_fd512dd5_for_handler_ *)&q);
      aaStack_120[0]._0_8_ = pcVar6;
      boost::asio::detail::scheduler::post_immediate_completion
                (piVar3->impl_,(operation *)pcVar6,false);
      local_128 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)0x0;
      aaStack_120[0]._M_allocated_capacity =
           (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            *)0x0;
      boost::asio::detail::
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
      ::ptr::~ptr((ptr *)local_130);
      goto LAB_002212b0;
    }
  }
  else if (((flags.m_val & 1) != 0) ||
          (lVar1 = (this->m_timeout).__r,
          lVar2 = *(long *)((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                                  ._M_cur + 0x28), tVar5 = aux::time_now(),
          (long)tVar5.__d.__r <= lVar1 + lVar2)) {
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              (&ips,(vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                    ((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                           ._M_cur + 0x30));
    piVar3 = this->m_ios;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)&q.hints_.ai_socktype,h);
    q.hints_.ai_next = (addrinfo *)CONCAT44(ec._4_4_,ec.val_);
    q.host_name_._M_dataplus._M_p = (pointer)ec.cat_;
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               &q.host_name_._M_string_length,&ips);
    local_130 = (undefined1  [8])&q;
    pcVar6 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
              *)boost::asio::asio_handler_allocate(0x70);
    aaStack_120[0]._M_allocated_capacity =
         (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *)0x0;
    (pcVar6->super_operation).next_ = (scheduler_operation *)0x0;
    (pcVar6->super_operation).func_ =
         boost::asio::detail::
         completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
         ::do_complete;
    (pcVar6->super_operation).task_result_ = 0;
    local_128 = pcVar6;
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
    ::$_1::__1((__1 *)&pcVar6->handler_,(anon_class_80_4_6b615590_for_handler_ *)&q);
    aaStack_120[0]._0_8_ = pcVar6;
    boost::asio::detail::scheduler::post_immediate_completion
              (piVar3->impl_,(operation *)pcVar6,false);
    local_128 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)0x0;
    aaStack_120[0]._M_allocated_capacity =
         (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *)0x0;
    boost::asio::detail::
    completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
    ::ptr::~ptr((ptr *)local_130);
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
    ::$_1::~__1((__1 *)&q);
    std::_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
    ~_Vector_base(&ips.
                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                 );
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"80",(allocator<char> *)&ips);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&q,host,(string *)local_130,address_configured);
  std::__cxx11::string::~string((string *)local_130);
  local_e0._M_head_impl = this;
  if ((flags.m_val & 2) == 0) {
    local_130 = (undefined1  [8])on_lookup;
    local_128 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)0x0;
    std::
    _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)aaStack_120,h,host);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>>
              ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_critical_resolver,&q,
               (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_130);
  }
  else {
    local_130 = (undefined1  [8])on_lookup;
    local_128 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)0x0;
    std::
    _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)aaStack_120,h,host);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>>
              ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_resolver,&q,
               (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_130);
  }
  std::
  _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)aaStack_120);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query(&q);
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t const& h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			m_ios.post([=]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= aux::time_now())
			{
				std::vector<address> ips = i->second.addresses;
				m_ios.post([=] { callback(h, ec, ips); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			m_ios.post([=] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		// the port is ignored
		tcp::resolver::query const q(host, "80");

		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
		else
		{
			m_critical_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
	}